

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcOrientedEdge::IfcOrientedEdge(IfcOrientedEdge *this)

{
  *(undefined ***)&this->field_0x78 = &PTR__Object_00836880;
  *(undefined8 *)&this->field_0x80 = 0;
  *(char **)&this->field_0x88 = "IfcOrientedEdge";
  IfcEdge::IfcEdge(&this->super_IfcEdge,&PTR_construction_vtable_24__00850ef0);
  *(undefined8 *)&(this->super_IfcEdge).field_0x48 = 0;
  *(undefined8 *)&(this->super_IfcEdge).field_0x50 = 0;
  (this->super_IfcEdge).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x850e38;
  *(undefined8 *)&this->field_0x78 = 0x850ed8;
  *(undefined8 *)
   &(this->super_IfcEdge).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x850e60;
  *(undefined8 *)
   &(this->super_IfcEdge).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x850e88;
  *(undefined8 *)&(this->super_IfcEdge).field_0x40 = 0x850eb0;
  (this->Orientation)._M_dataplus._M_p = (pointer)&(this->Orientation).field_2;
  (this->Orientation)._M_string_length = 0;
  (this->Orientation).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

IfcOrientedEdge() : Object("IfcOrientedEdge") {}